

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilIsop.c
# Opt level: O3

int Abc_IsopCountLits(Vec_Int_t *vCover,int nVars)

{
  uint uVar1;
  int iVar2;
  byte bVar3;
  int *piVar4;
  ulong uVar5;
  int iVar6;
  
  uVar1 = vCover->nSize;
  if ((ulong)uVar1 == 0) {
    return uVar1;
  }
  if (uVar1 == 1) {
    piVar4 = vCover->pArray;
    if (*piVar4 != 0) {
LAB_004145fe:
      uVar5 = 0;
      iVar2 = 0;
      do {
        if (0 < nVars) {
          bVar3 = 0;
          iVar6 = nVars;
          do {
            switch(piVar4[uVar5] >> (bVar3 & 0x1f) & 3) {
            case 0:
              goto switchD_00414626_caseD_0;
            case 3:
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilIsop.c"
                            ,0x26e,"int Abc_IsopCountLits(Vec_Int_t *, int)");
            }
            iVar2 = iVar2 + 1;
switchD_00414626_caseD_0:
            bVar3 = bVar3 + 2;
            iVar6 = iVar6 + -1;
          } while (iVar6 != 0);
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 != uVar1);
      return iVar2;
    }
  }
  else if (0 < (int)uVar1) {
    piVar4 = vCover->pArray;
    goto LAB_004145fe;
  }
  return 0;
}

Assistant:

int Abc_IsopCountLits( Vec_Int_t * vCover, int nVars )
{
    int i, k, Entry, Literal, nLits = 0;
    if ( Vec_IntSize(vCover) == 0 || (Vec_IntSize(vCover) == 1 && Vec_IntEntry(vCover, 0) == 0) )
        return 0;
    Vec_IntForEachEntry( vCover, Entry, i )
    { 
        for ( k = 0; k < nVars; k++ )
        {
            Literal = 3 & (Entry >> (k << 1));
            if ( Literal == 1 ) // neg literal
                nLits++;
            else if ( Literal == 2 ) // pos literal
                nLits++;
            else if ( Literal != 0 ) 
                assert( 0 );
        }
    }
    return nLits;
}